

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDockAreaLayoutItem * __thiscall
QDockAreaLayoutInfo::item(QDockAreaLayoutInfo *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  qsizetype qVar3;
  QDockAreaLayoutInfo *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  int index;
  qsizetype in_stack_ffffffffffffff98;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = QList<int>::first((QList<int> *)in_stack_ffffffffffffffa0);
  iVar4 = *piVar2;
  qVar3 = QList<int>::size((QList<int> *)in_RSI);
  if (qVar3 < 2) {
    local_28 = QList<QDockAreaLayoutItem>::operator[]
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    QList<QDockAreaLayoutItem>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QList<int>::mid(in_RDI,(qsizetype)in_RSI,CONCAT44(iVar4,in_stack_ffffffffffffffc0));
    local_28 = QDockAreaLayoutInfo::item
                         (in_RSI,(QList<int> *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
    QList<int>::~QList((QList<int> *)0x572a88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutItem &QDockAreaLayoutInfo::item(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    if (path.size() > 1) {
        const QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->item(path.mid(1));
    }
    return item_list[index];
}